

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O1

bool CoreML::Specification::operator==(CategoricalMapping *a,CategoricalMapping *b)

{
  uint32 uVar1;
  StringToInt64Map *pSVar2;
  bool bVar3;
  StringToInt64Map *pSVar4;
  Int64ToStringMap *pIVar5;
  
  uVar1 = a->_oneof_case_[0];
  if (uVar1 == b->_oneof_case_[0]) {
    if (uVar1 != 0) {
      if (uVar1 == 1) {
        pSVar2 = (a->MappingType_).stringtoint64map_;
        if (b->_oneof_case_[0] == 1) {
          pSVar4 = (b->MappingType_).stringtoint64map_;
        }
        else {
          pSVar4 = StringToInt64Map::default_instance();
        }
        bVar3 = operator==(&(pSVar2->map_).map_,&(pSVar4->map_).map_);
        return bVar3;
      }
      pSVar2 = (a->MappingType_).stringtoint64map_;
      if (b->_oneof_case_[0] == 2) {
        pIVar5 = (Int64ToStringMap *)(b->MappingType_).stringtoint64map_;
      }
      else {
        pIVar5 = Int64ToStringMap::default_instance();
      }
      bVar3 = operator==((Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&(pSVar2->map_).map_,&(pIVar5->map_).map_);
      return bVar3;
    }
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator==(const NeuralNetworkImageScaler& a,
                        const NeuralNetworkImageScaler& b) {
            if (a.redbias() != b.redbias()) {
                return false;
            }
            if (a.bluebias() != b.bluebias()) {
                return false;
            }
            if (a.greenbias() != b.greenbias()) {
                return false;
            }
            if (a.graybias() != b.graybias()) {
                return false;
            }
            if (a.channelscale() != b.channelscale()) {
                return false;
            }
            return true;
        }